

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

void __thiscall Am_Point_List_Data::Print(Am_Point_List_Data *this,ostream *os)

{
  undefined8 in_RAX;
  ostream *poVar1;
  Am_Point_Item *pAVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"LIST(",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
  pAVar2 = this->head;
  if (pAVar2 != this->tail) {
    do {
      uStack_38._0_4_ = CONCAT13(0x28,(undefined3)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 3),1);
      poVar1 = std::ostream::_M_insert<double>((double)pAVar2->x);
      uStack_38._0_5_ = CONCAT14(0x2c,(undefined4)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 4),1);
      poVar1 = std::ostream::_M_insert<double>((double)pAVar2->y);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
      pAVar2 = pAVar2->next;
    } while (pAVar2 != this->tail);
  }
  if (pAVar2 != (Am_Point_Item *)0x0) {
    uStack_38._0_6_ = CONCAT15(0x28,(undefined5)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 5),1);
    poVar1 = std::ostream::_M_insert<double>((double)pAVar2->x);
    uStack_38._0_7_ = CONCAT16(0x2c,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 6),1);
    poVar1 = std::ostream::_M_insert<double>((double)pAVar2->y);
    uStack_38 = CONCAT17(0x29,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return;
}

Assistant:

void
Am_Point_List_Data::Print(std::ostream &os) const
{
  Am_Point_Item *current;
  os << "LIST(" << number << ") [";
  for (current = head; current != tail; current = current->next) {
    os << '(' << current->x << ',' << current->y << ") ";
  }
  if (current) {
    os << '(' << current->x << ',' << current->y << ')';
  }
  os << "]";
}